

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_external_replayer_linux.hpp
# Opt level: O3

PollResult __thiscall
Fossilize::ExternalReplayer::Impl::poll_progress(Impl *this,Progress *progress)

{
  __int_type _Var1;
  __pid_t _Var2;
  uint uVar3;
  int iVar4;
  PollResult PVar5;
  int *piVar6;
  uint uVar7;
  ulong uVar8;
  SharedControlBlock *pSVar9;
  size_t __n;
  void *__src;
  bool bVar10;
  char buf [64];
  char local_78 [72];
  
  _Var1 = (this->shm_block->progress_complete).super___atomic_base<unsigned_int>._M_i;
  _Var2 = this->pid;
  if (_Var1 == 0 && _Var2 < 0) {
    return Error;
  }
  if (-1 < _Var2 && _Var1 == 0) {
    _Var2 = waitpid(_Var2,&this->wstatus,1);
    if (_Var2 < 1) {
      if (-1 < _Var2) goto LAB_00183889;
      piVar6 = __errno_location();
      this->wstatus = -*piVar6;
      this->synthesized_exit_code = true;
    }
    else {
      uVar3 = this->wstatus & 0x7f;
      if ((uVar3 != 0) && ((int)(uVar3 * 0x1000000 + 0x1000000) < 0x2000000)) goto LAB_00183889;
    }
    reset_pid(this);
  }
LAB_00183889:
  if ((this->shm_block->progress_started).super___atomic_base<unsigned_int>._M_i == 0) {
    PVar5 = ResultNotReady;
  }
  else {
    pSVar9 = this->shm_block;
    (progress->compute).total = (pSVar9->total_compute).super___atomic_base<unsigned_int>._M_i;
    (progress->compute).parsed = (pSVar9->parsed_compute).super___atomic_base<unsigned_int>._M_i;
    (progress->compute).parsed_fail =
         (pSVar9->parsed_compute_failures).super___atomic_base<unsigned_int>._M_i;
    (progress->compute).skipped = (pSVar9->skipped_compute).super___atomic_base<unsigned_int>._M_i;
    (progress->compute).cached = (pSVar9->cached_compute).super___atomic_base<unsigned_int>._M_i;
    (progress->compute).completed =
         (pSVar9->successful_compute).super___atomic_base<unsigned_int>._M_i;
    (progress->graphics).total = (pSVar9->total_graphics).super___atomic_base<unsigned_int>._M_i;
    (progress->graphics).parsed = (pSVar9->parsed_graphics).super___atomic_base<unsigned_int>._M_i;
    (progress->graphics).parsed_fail =
         (pSVar9->parsed_graphics_failures).super___atomic_base<unsigned_int>._M_i;
    (progress->graphics).skipped = (pSVar9->skipped_graphics).super___atomic_base<unsigned_int>._M_i
    ;
    (progress->graphics).cached = (pSVar9->cached_graphics).super___atomic_base<unsigned_int>._M_i;
    (progress->graphics).completed =
         (pSVar9->successful_graphics).super___atomic_base<unsigned_int>._M_i;
    (progress->raytracing).total = (pSVar9->total_raytracing).super___atomic_base<unsigned_int>._M_i
    ;
    (progress->raytracing).parsed =
         (pSVar9->parsed_raytracing).super___atomic_base<unsigned_int>._M_i;
    (progress->raytracing).parsed_fail =
         (pSVar9->parsed_raytracing).super___atomic_base<unsigned_int>._M_i;
    (progress->raytracing).skipped =
         (pSVar9->skipped_raytracing).super___atomic_base<unsigned_int>._M_i;
    (progress->raytracing).cached =
         (pSVar9->cached_raytracing).super___atomic_base<unsigned_int>._M_i;
    (progress->raytracing).completed =
         (pSVar9->successful_raytracing).super___atomic_base<unsigned_int>._M_i;
    progress->completed_modules =
         (pSVar9->successful_modules).super___atomic_base<unsigned_int>._M_i;
    progress->missing_modules =
         (pSVar9->parsed_module_failures).super___atomic_base<unsigned_int>._M_i;
    progress->total_modules = (pSVar9->total_modules).super___atomic_base<unsigned_int>._M_i;
    progress->banned_modules = (pSVar9->banned_modules).super___atomic_base<unsigned_int>._M_i;
    progress->module_validation_failures =
         (pSVar9->module_validation_failures).super___atomic_base<unsigned_int>._M_i;
    progress->clean_crashes = (pSVar9->clean_process_deaths).super___atomic_base<unsigned_int>._M_i;
    progress->dirty_crashes = (pSVar9->dirty_process_deaths).super___atomic_base<unsigned_int>._M_i;
    progress->total_graphics_pipeline_blobs =
         (pSVar9->static_total_count_graphics).super___atomic_base<unsigned_int>._M_i;
    progress->total_compute_pipeline_blobs =
         (pSVar9->static_total_count_compute).super___atomic_base<unsigned_int>._M_i;
    progress->total_raytracing_pipeline_blobs =
         (pSVar9->static_total_count_raytracing).super___atomic_base<unsigned_int>._M_i;
    LOCK();
    iVar4 = pSVar9->futex_lock;
    bVar10 = iVar4 == 0;
    if (bVar10) {
      pSVar9->futex_lock = 1;
      iVar4 = 0;
    }
    UNLOCK();
    if (!bVar10) {
      piVar6 = &pSVar9->futex_lock;
      do {
        if (iVar4 == 2) {
LAB_001839a8:
          syscall(0xca,piVar6,0,2,0,0,0);
        }
        else {
          LOCK();
          iVar4 = *piVar6;
          if (iVar4 == 1) {
            *piVar6 = 2;
            iVar4 = 1;
          }
          UNLOCK();
          if (iVar4 != 0) goto LAB_001839a8;
        }
        LOCK();
        iVar4 = *piVar6;
        bVar10 = iVar4 == 0;
        if (bVar10) {
          *piVar6 = 2;
          iVar4 = 0;
        }
        UNLOCK();
      } while (!bVar10);
    }
    pSVar9 = this->shm_block;
    uVar3 = pSVar9->write_count - pSVar9->read_count;
    if (0x3f < uVar3) {
      uVar8 = 0x40;
      do {
        local_78[0x30] = '\0';
        local_78[0x31] = '\0';
        local_78[0x32] = '\0';
        local_78[0x33] = '\0';
        local_78[0x34] = '\0';
        local_78[0x35] = '\0';
        local_78[0x36] = '\0';
        local_78[0x37] = '\0';
        local_78[0x38] = '\0';
        local_78[0x39] = '\0';
        local_78[0x3a] = '\0';
        local_78[0x3b] = '\0';
        local_78[0x3c] = '\0';
        local_78[0x3d] = '\0';
        local_78[0x3e] = '\0';
        local_78[0x3f] = '\0';
        local_78[0x20] = '\0';
        local_78[0x21] = '\0';
        local_78[0x22] = '\0';
        local_78[0x23] = '\0';
        local_78[0x24] = '\0';
        local_78[0x25] = '\0';
        local_78[0x26] = '\0';
        local_78[0x27] = '\0';
        local_78[0x28] = '\0';
        local_78[0x29] = '\0';
        local_78[0x2a] = '\0';
        local_78[0x2b] = '\0';
        local_78[0x2c] = '\0';
        local_78[0x2d] = '\0';
        local_78[0x2e] = '\0';
        local_78[0x2f] = '\0';
        local_78[0x10] = '\0';
        local_78[0x11] = '\0';
        local_78[0x12] = '\0';
        local_78[0x13] = '\0';
        local_78[0x14] = '\0';
        local_78[0x15] = '\0';
        local_78[0x16] = '\0';
        local_78[0x17] = '\0';
        local_78[0x18] = '\0';
        local_78[0x19] = '\0';
        local_78[0x1a] = '\0';
        local_78[0x1b] = '\0';
        local_78[0x1c] = '\0';
        local_78[0x1d] = '\0';
        local_78[0x1e] = '\0';
        local_78[0x1f] = '\0';
        local_78[0] = '\0';
        local_78[1] = '\0';
        local_78[2] = '\0';
        local_78[3] = '\0';
        local_78[4] = '\0';
        local_78[5] = '\0';
        local_78[6] = '\0';
        local_78[7] = '\0';
        local_78[8] = '\0';
        local_78[9] = '\0';
        local_78[10] = '\0';
        local_78[0xb] = '\0';
        local_78[0xc] = '\0';
        local_78[0xd] = '\0';
        local_78[0xe] = '\0';
        local_78[0xf] = '\0';
        pSVar9 = this->shm_block;
        if ((0x3f < pSVar9->ring_buffer_size) && (0x3f < pSVar9->write_count - pSVar9->read_count))
        {
          __src = (void *)((long)&pSVar9->version_cookie + (ulong)pSVar9->ring_buffer_offset);
          uVar7 = pSVar9->ring_buffer_size - pSVar9->read_offset;
          __n = 0x40;
          if (uVar7 < 0x40) {
            __n = (size_t)uVar7;
          }
          memcpy(local_78,(void *)((ulong)pSVar9->read_offset + (long)__src),__n);
          if (uVar7 < 0x40) {
            memcpy(local_78 + __n,__src,(ulong)(0x40 - (int)__n));
          }
          pSVar9->read_offset = pSVar9->ring_buffer_size - 1 & pSVar9->read_offset + 0x40;
          pSVar9->read_count = pSVar9->read_count + 0x40;
        }
        parse_message(this,local_78);
        uVar8 = uVar8 + 0x40;
      } while (uVar8 <= uVar3);
      pSVar9 = this->shm_block;
    }
    LOCK();
    piVar6 = &pSVar9->futex_lock;
    iVar4 = *piVar6;
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (iVar4 == 2) {
      LOCK();
      pSVar9->futex_lock = 0;
      UNLOCK();
      syscall(0xca,&pSVar9->futex_lock,1,1,0,0,0);
    }
    PVar5 = (PollResult)(_Var1 != 0);
  }
  return PVar5;
}

Assistant:

ExternalReplayer::PollResult ExternalReplayer::Impl::poll_progress(ExternalReplayer::Progress &progress)
{
	bool complete = shm_block->progress_complete.load(std::memory_order_acquire) != 0;

	if (pid < 0 && !complete)
		return ExternalReplayer::PollResult::Error;

	// Try to avoid a situation where we're endlessly polling, in case the application died too early during startup and we failed
	// to catch it ending by receiving a completed wait through is_process_complete().
	if (!complete && pid >= 0)
	{
		int ret;
		// This serves as a check to see if process is still alive.
		if ((ret = waitpid(pid, &wstatus, WNOHANG)) > 0)
		{
			// Child process can receive SIGCONT/SIGSTOP which is benign.
			// This should normally only happen when the process is being debugged.
			if (WIFEXITED(wstatus) || WIFSIGNALED(wstatus))
				reset_pid();
		}
		else if (ret < 0)
		{
			// The child does not exist anymore, and we were unable to reap it.
			// This can happen if the process installed a SIGCHLD handler behind our back.
			wstatus = -errno;
			synthesized_exit_code = true;
			reset_pid();
		}

		// If ret is 0, that means the process is still alive and nothing happened to it yet.
	}

	if (shm_block->progress_started.load(std::memory_order_acquire) == 0)
		return ExternalReplayer::PollResult::ResultNotReady;

	progress.compute.total = shm_block->total_compute.load(std::memory_order_relaxed);
	progress.compute.parsed = shm_block->parsed_compute.load(std::memory_order_relaxed);
	progress.compute.parsed_fail = shm_block->parsed_compute_failures.load(std::memory_order_relaxed);
	progress.compute.skipped = shm_block->skipped_compute.load(std::memory_order_relaxed);
	progress.compute.cached = shm_block->cached_compute.load(std::memory_order_relaxed);
	progress.compute.completed = shm_block->successful_compute.load(std::memory_order_relaxed);

	progress.graphics.total = shm_block->total_graphics.load(std::memory_order_relaxed);
	progress.graphics.parsed = shm_block->parsed_graphics.load(std::memory_order_relaxed);
	progress.graphics.parsed_fail = shm_block->parsed_graphics_failures.load(std::memory_order_relaxed);
	progress.graphics.skipped = shm_block->skipped_graphics.load(std::memory_order_relaxed);
	progress.graphics.cached = shm_block->cached_graphics.load(std::memory_order_relaxed);
	progress.graphics.completed = shm_block->successful_graphics.load(std::memory_order_relaxed);

	progress.raytracing.total = shm_block->total_raytracing.load(std::memory_order_relaxed);
	progress.raytracing.parsed = shm_block->parsed_raytracing.load(std::memory_order_relaxed);
	progress.raytracing.parsed_fail = shm_block->parsed_raytracing.load(std::memory_order_relaxed);
	progress.raytracing.skipped = shm_block->skipped_raytracing.load(std::memory_order_relaxed);
	progress.raytracing.cached = shm_block->cached_raytracing.load(std::memory_order_relaxed);
	progress.raytracing.completed = shm_block->successful_raytracing.load(std::memory_order_relaxed);

	progress.completed_modules = shm_block->successful_modules.load(std::memory_order_relaxed);
	progress.missing_modules = shm_block->parsed_module_failures.load(std::memory_order_relaxed);
	progress.total_modules = shm_block->total_modules.load(std::memory_order_relaxed);
	progress.banned_modules = shm_block->banned_modules.load(std::memory_order_relaxed);
	progress.module_validation_failures = shm_block->module_validation_failures.load(std::memory_order_relaxed);
	progress.clean_crashes = shm_block->clean_process_deaths.load(std::memory_order_relaxed);
	progress.dirty_crashes = shm_block->dirty_process_deaths.load(std::memory_order_relaxed);

	progress.total_graphics_pipeline_blobs = shm_block->static_total_count_graphics.load(std::memory_order_relaxed);
	progress.total_compute_pipeline_blobs = shm_block->static_total_count_compute.load(std::memory_order_relaxed);
	progress.total_raytracing_pipeline_blobs = shm_block->static_total_count_raytracing.load(std::memory_order_relaxed);

	futex_wrapper_lock(&shm_block->futex_lock);
	size_t read_avail = shared_control_block_read_avail(shm_block);
	for (size_t i = ControlBlockMessageSize; i <= read_avail; i += ControlBlockMessageSize)
	{
		char buf[ControlBlockMessageSize] = {};
		shared_control_block_read(shm_block, buf, sizeof(buf));
		parse_message(buf);
	}
	futex_wrapper_unlock(&shm_block->futex_lock);
	return complete ? ExternalReplayer::PollResult::Complete : ExternalReplayer::PollResult::Running;
}